

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O3

InputSource * __thiscall
xercesc_4_0::DGXMLScanner::resolveSystemId(DGXMLScanner *this,XMLCh *sysId,XMLCh *pubId)

{
  XMLBufferMgr *this_00;
  ReaderMgr *this_01;
  XMLCh *pXVar1;
  XMLEntityHandler *pXVar2;
  bool bVar3;
  int iVar4;
  XMLBuffer *dstBuffer;
  XMLBuffer *this_02;
  undefined4 extraout_var;
  XMLBuffer *normalizedURI;
  URLInputSource *this_03;
  MalformedURLException *this_04;
  XMLBufBid ddSys;
  XMLBufBid bbSys;
  XMLBufBid nnSys;
  LastExtEntityInfo lastInfo;
  XMLResourceIdentifier resourceIdentifier;
  LastExtEntityInfo local_a8;
  XMLURL local_88;
  
  this_00 = &(this->super_XMLScanner).fBufMgr;
  dstBuffer = XMLBufferMgr::bidOnBuffer(this_00);
  local_88._vptr_XMLURL._0_4_ = CONCAT22(local_88._vptr_XMLURL._2_2_,0xffff);
  XMLString::removeChar(sysId,(XMLCh *)&local_88,dstBuffer);
  pXVar1 = dstBuffer->fBuffer;
  pXVar1[dstBuffer->fIndex] = L'\0';
  this_02 = XMLBufferMgr::bidOnBuffer(this_00);
  pXVar2 = (this->super_XMLScanner).fEntityHandler;
  if (pXVar2 == (XMLEntityHandler *)0x0) {
    this_02->fIndex = 0;
    if (*pXVar1 != L'\0') {
      XMLBuffer::append(this_02,pXVar1);
    }
  }
  else {
    iVar4 = (*pXVar2->_vptr_XMLEntityHandler[3])(pXVar2,pXVar1,this_02);
    if (((char)iVar4 == '\0') && (this_02->fIndex = 0, *pXVar1 != L'\0')) {
      XMLBuffer::append(this_02,pXVar1);
    }
    this_01 = &(this->super_XMLScanner).fReaderMgr;
    ReaderMgr::getLastExtEntityInfo(this_01,&local_a8);
    local_88.fFragment = this_02->fBuffer;
    local_88.fFragment[this_02->fIndex] = L'\0';
    local_88._vptr_XMLURL._0_4_ = 4;
    local_88.fHost = local_a8.systemId;
    local_88.fPassword = (XMLCh *)0x0;
    local_88.fMemoryManager = (MemoryManager *)pubId;
    local_88.fPath = (XMLCh *)this_01;
    iVar4 = (*((this->super_XMLScanner).fEntityHandler)->_vptr_XMLEntityHandler[5])();
    this_03 = (URLInputSource *)CONCAT44(extraout_var,iVar4);
    if (this_03 != (URLInputSource *)0x0) goto LAB_0029902b;
  }
  if ((this->super_XMLScanner).fDisableDefaultEntityResolution == false) {
    ReaderMgr::getLastExtEntityInfo(&(this->super_XMLScanner).fReaderMgr,&local_a8);
    XMLURL::XMLURL(&local_88,(this->super_XMLScanner).fMemoryManager);
    pXVar1 = this_02->fBuffer;
    pXVar1[this_02->fIndex] = L'\0';
    bVar3 = XMLURL::setURL(&local_88,local_a8.systemId,pXVar1,&local_88);
    if ((!bVar3) || (bVar3 = XMLURL::isRelative(&local_88), bVar3)) {
      if ((this->super_XMLScanner).fStandardUriConformant != false) {
        this_04 = (MalformedURLException *)__cxa_allocate_exception(0x30);
        MalformedURLException::MalformedURLException
                  (this_04,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
                   ,0xabc,URL_MalformedURL,(this->super_XMLScanner).fMemoryManager);
        goto LAB_00299084;
      }
      normalizedURI = XMLBufferMgr::bidOnBuffer(this_00);
      pXVar1 = this_02->fBuffer;
      pXVar1[this_02->fIndex] = L'\0';
      XMLUri::normalizeURI(pXVar1,normalizedURI);
      this_03 = (URLInputSource *)
                XMemory::operator_new(0x30,(this->super_XMLScanner).fMemoryManager);
      pXVar1 = normalizedURI->fBuffer;
      pXVar1[normalizedURI->fIndex] = L'\0';
      LocalFileInputSource::LocalFileInputSource
                ((LocalFileInputSource *)this_03,local_a8.systemId,pXVar1,
                 (this->super_XMLScanner).fMemoryManager);
      XMLBufferMgr::releaseBuffer(this_00,normalizedURI);
    }
    else {
      if (((this->super_XMLScanner).fStandardUriConformant == true) &&
         (bVar3 = XMLURL::hasInvalidChar(&local_88), bVar3)) {
        this_04 = (MalformedURLException *)__cxa_allocate_exception(0x30);
        MalformedURLException::MalformedURLException
                  (this_04,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
                   ,0xac1,URL_MalformedURL,(this->super_XMLScanner).fMemoryManager);
LAB_00299084:
        __cxa_throw(this_04,&MalformedURLException::typeinfo,XMLException::~XMLException);
      }
      this_03 = (URLInputSource *)
                XMemory::operator_new(0x88,(this->super_XMLScanner).fMemoryManager);
      URLInputSource::URLInputSource(this_03,&local_88,(this->super_XMLScanner).fMemoryManager);
    }
    XMLURL::~XMLURL(&local_88);
  }
  else {
    this_03 = (URLInputSource *)0x0;
  }
LAB_0029902b:
  XMLBufferMgr::releaseBuffer(this_00,this_02);
  XMLBufferMgr::releaseBuffer(this_00,dstBuffer);
  return &this_03->super_InputSource;
}

Assistant:

InputSource* DGXMLScanner::resolveSystemId(const XMLCh* const sysId
                                          ,const XMLCh* const pubId)
{
    //Normalize sysId
    XMLBufBid nnSys(&fBufMgr);
    XMLBuffer& normalizedSysId = nnSys.getBuffer();
    XMLString::removeChar(sysId, 0xFFFF, normalizedSysId);
    const XMLCh* normalizedURI = normalizedSysId.getRawBuffer();

    // Create a buffer for expanding the normalized system id
    XMLBufBid bbSys(&fBufMgr);
    XMLBuffer& expSysId = bbSys.getBuffer();

    //  Allow the entity handler to expand the system id if they choose
    //  to do so.
    InputSource* srcToFill = 0;
    if (fEntityHandler)
    {
        if (!fEntityHandler->expandSystemId(normalizedURI, expSysId))
            expSysId.set(normalizedURI);

        ReaderMgr::LastExtEntityInfo lastInfo;
        fReaderMgr.getLastExtEntityInfo(lastInfo);
        XMLResourceIdentifier resourceIdentifier(XMLResourceIdentifier::ExternalEntity,
                            expSysId.getRawBuffer(), 0, pubId, lastInfo.systemId,
                            &fReaderMgr);
        srcToFill = fEntityHandler->resolveEntity(&resourceIdentifier);
    }
    else
    {
        expSysId.set(normalizedURI);
    }

    //  If they didn't create a source via the entity handler, then we
    //  have to create one on our own.
    if (!srcToFill)
    {
        if (fDisableDefaultEntityResolution)
            return srcToFill;

        ReaderMgr::LastExtEntityInfo lastInfo;
        fReaderMgr.getLastExtEntityInfo(lastInfo);

        XMLURL urlTmp(fMemoryManager);
        if ((!urlTmp.setURL(lastInfo.systemId, expSysId.getRawBuffer(), urlTmp)) ||
            (urlTmp.isRelative()))
        {
            if (!fStandardUriConformant)
            {
                XMLBufBid  ddSys(&fBufMgr);
                XMLBuffer& resolvedSysId = ddSys.getBuffer();
                XMLUri::normalizeURI(expSysId.getRawBuffer(), resolvedSysId);

                srcToFill = new (fMemoryManager) LocalFileInputSource
                (
                    lastInfo.systemId
                    , resolvedSysId.getRawBuffer()
                    , fMemoryManager
                );
            }
            else
                ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_MalformedURL, fMemoryManager);
        }
        else
        {
            if (fStandardUriConformant && urlTmp.hasInvalidChar())
                ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_MalformedURL, fMemoryManager);
            srcToFill = new (fMemoryManager) URLInputSource(urlTmp, fMemoryManager);
        }
    }

    return srcToFill;
}